

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

context_t __thiscall cs::create_subcontext(cs *this,context_t *cxt)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  domain_manager *pdVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  context_t cVar8;
  any aStack_2f8;
  any local_2f0;
  any local_2e8;
  any local_2e0;
  any local_2d8;
  var local_2d0;
  var local_2c8;
  var local_2c0;
  var local_2b8;
  var local_2b0;
  var local_2a8;
  var local_2a0;
  any local_298;
  any local_290;
  undefined1 local_288 [16];
  _Manager_type local_278;
  code *local_270;
  namespace_t local_268;
  namespace_t local_258;
  namespace_t local_248;
  namespace_t local_238;
  namespace_t local_228;
  namespace_t local_218;
  namespace_t local_208;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  type_index local_138;
  type_index local_130;
  type_index local_128;
  type_index local_120;
  type_index local_118;
  type_index local_110;
  type_index local_108;
  types local_fc;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  type_index local_50;
  type_index local_48;
  type_index local_40;
  type_index local_38;
  type_index local_30;
  
  cs_impl::init_extensions((cs_impl *)this);
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::context_type,std::allocator<cs::context_type>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(context_type **)this,
             (allocator<cs::context_type> *)local_288);
  local_288._0_8_ = (instance_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::instance_type,std::allocator<cs::instance_type>,std::shared_ptr<cs::context_type>&,cs::stack_type<cs::domain_type,std::allocator>*&,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),
             (instance_type **)local_288,(allocator<cs::instance_type> *)&local_f8,
             (shared_ptr<cs::context_type> *)this,
             &((((cxt->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              fiber_sp,(unsigned_long *)(current_process + 0x78));
  uVar5 = local_288._8_8_;
  uVar4 = local_288._0_8_;
  lVar1 = *(long *)this;
  local_288._0_8_ = (instance_type *)0x0;
  local_288._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x18);
  *(undefined8 *)(lVar1 + 0x10) = uVar4;
  *(undefined8 *)(lVar1 + 0x18) = uVar5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
  }
  peVar2 = (cxt->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  puVar3 = *(undefined8 **)this;
  *puVar3 = (peVar2->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar3 + 1),
             &(peVar2->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cs_impl::any::operator=
            ((any *)(*(long *)this + 0xb0),
             &((cxt->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              cmd_args);
  lVar1 = *(long *)(*(long *)this + 0x10);
  local_288._0_8_ = (instance_type *)0x0;
  local_288._8_8_ = 0;
  local_270 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:560:29)>
              ::_M_invoke;
  local_278 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:560:29)>
              ::_M_manager;
  local_108._M_target = (type_info *)&char::typeinfo;
  local_208.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::char_ext;
  local_208.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_0026a130;
  if (DAT_0026a130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_0026a130->_M_use_count = DAT_0026a130->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_0026a130->_M_use_count = DAT_0026a130->_M_use_count + 1;
    }
  }
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[5]>
                     ((domain_manager *)(lVar1 + 0x30),(char (*) [5])0x1f7530,
                      (function<cs_impl::any_()> *)local_288,&local_108,&local_208);
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:562:31)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:562:31)>
             ::_M_manager;
  local_30._M_target = (type_info *)&numeric::typeinfo;
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[7]>
                     (pdVar6,(char (*) [7])0x205918,(function<cs_impl::any_()> *)&local_f8,&local_30
                     );
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:563:32)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:563:32)>
             ::_M_manager;
  local_38._M_target = (type_info *)&numeric::typeinfo;
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar6,(char (*) [8])0x200cb5,(function<cs_impl::any_()> *)&local_78,&local_38
                     );
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:564:30)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:564:30)>
             ::_M_manager;
  local_40._M_target = (type_info *)&numeric::typeinfo;
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[6]>
                     (pdVar6,(char (*) [6])0x205481,(function<cs_impl::any_()> *)&local_98,&local_40
                     );
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:565:32)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:565:32)>
             ::_M_manager;
  local_48._M_target = (type_info *)&bool::typeinfo;
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar6,(char (*) [8])0x1f186c,(function<cs_impl::any_()> *)&local_b8,&local_48
                     );
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:566:32)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:566:32)>
             ::_M_manager;
  local_50._M_target = (type_info *)&pointer::typeinfo;
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar6,(char (*) [8])0x1f1860,(function<cs_impl::any_()> *)&local_d8,&local_50
                     );
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:567:31)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:567:31)>
              ::_M_manager;
  local_110._M_target = (type_info *)&std::__cxx11::string::typeinfo;
  local_218.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::string_ext;
  local_218.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_0026a1e0;
  if (DAT_0026a1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_0026a1e0->_M_use_count = DAT_0026a1e0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_0026a1e0->_M_use_count = DAT_0026a1e0->_M_use_count + 1;
    }
  }
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[7]>
                     (pdVar6,(char (*) [7])0x1ebf02,(function<cs_impl::any_()> *)&local_158,
                      &local_110,&local_218);
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_160 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:569:29)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:569:29)>
              ::_M_manager;
  local_118._M_target =
       (type_info *)&std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo;
  local_228.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::list_ext;
  local_228.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_0026a160;
  if (DAT_0026a160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_0026a160->_M_use_count = DAT_0026a160->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_0026a160->_M_use_count = DAT_0026a160->_M_use_count + 1;
    }
  }
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[5]>
                     (pdVar6,(char (*) [5])0x202450,(function<cs_impl::any_()> *)&local_178,
                      &local_118,&local_228);
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:570:30)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:570:30)>
              ::_M_manager;
  local_120._M_target =
       (type_info *)&std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo;
  local_238.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::array_ext;
  local_238.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_0026a100;
  if (DAT_0026a100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_0026a100->_M_use_count = DAT_0026a100->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_0026a100->_M_use_count = DAT_0026a100->_M_use_count + 1;
    }
  }
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[6]>
                     (pdVar6,(char (*) [6])0x1f607c,(function<cs_impl::any_()> *)&local_198,
                      &local_120,&local_238);
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1a0 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:572:29)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:572:29)>
              ::_M_manager;
  local_128._M_target = (type_info *)&std::pair<cs_impl::any,cs_impl::any>::typeinfo;
  local_248.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::pair_ext;
  local_248.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_0026a1a0;
  if (DAT_0026a1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_0026a1a0->_M_use_count = DAT_0026a1a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_0026a1a0->_M_use_count = DAT_0026a1a0->_M_use_count + 1;
    }
  }
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[5]>
                     (pdVar6,(char (*) [5])0x1fb25f,(function<cs_impl::any_()> *)&local_1b8,
                      &local_128,&local_248);
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1c0 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:574:33)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:574:33)>
              ::_M_manager;
  local_130._M_target =
       (type_info *)
       &phmap::
        flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
        ::typeinfo;
  local_258.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::hash_set_ext;
  local_258.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_0026a180;
  if (DAT_0026a180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_0026a180->_M_use_count = DAT_0026a180->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_0026a180->_M_use_count = DAT_0026a180->_M_use_count + 1;
    }
  }
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (pdVar6,(char (*) [9])0x202f4b,(function<cs_impl::any_()> *)&local_1d8,
                      &local_130,&local_258);
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1e0 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:576:33)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:576:33)>
              ::_M_manager;
  local_138._M_target =
       (type_info *)
       &phmap::
        flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
        ::typeinfo;
  local_268.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::hash_map_ext;
  local_268.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_0026a190;
  if (DAT_0026a190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_0026a190->_M_use_count = DAT_0026a190->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_0026a190->_M_use_count = DAT_0026a190->_M_use_count + 1;
    }
  }
  pdVar6 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (pdVar6,(char (*) [9])0x20314d,(function<cs_impl::any_()> *)&local_1f8,
                      &local_138,&local_268);
  cs_impl::any::make_constant<std::shared_ptr<cs::context_type>,std::shared_ptr<cs::context_type>&>
            (&local_290,(shared_ptr<cs::context_type> *)this);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[8]>
                     (pdVar6,(char (*) [8])0x20315a,&local_290);
  local_fc = request_fold;
  cs_impl::any::
  make_protect<cs::callable,cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
            (&local_298,range,&local_fc);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[6]>
                     (pdVar6,(char (*) [6])0x201dc9,&local_298);
  make_cni<cs::numeric(&)(cs_impl::any_const&)>((cs *)&local_2a0,to_integer,true);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[11]>
                     (pdVar6,(char (*) [11])"to_integer",&local_2a0);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>((cs *)&local_2a8,to_string_abi_cxx11_,true)
  ;
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[10]>
                     (pdVar6,(char (*) [10])"to_string",&local_2a8);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>((cs *)&local_2b0,type_abi_cxx11_,true);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar6,(char (*) [5])0x1ffe52,&local_2b0);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((cs *)&local_2b8,clone,false);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[6]>
                     (pdVar6,(char (*) [6])"clone",&local_2b8);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((cs *)&local_2c0,move,false);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar6,(char (*) [5])0x205635,&local_2c0);
  make_cni<void(&)(cs_impl::any&,cs_impl::any&)>((cs *)&local_2c8,swap,true);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[5]>(pdVar6,(char (*) [5])"swap",&local_2c8)
  ;
  make_cni<bool(&)(cs::type_id_const&,cs::type_id_const&)>((cs *)&local_2d0,is_a,true);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[5]>(pdVar6,(char (*) [5])"is_a",&local_2d0)
  ;
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_2d8,(shared_ptr<cs::name_space> *)&cs_impl::except_ext);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[10]>
                     (pdVar6,(char (*) [10])0x207495,&local_2d8);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_2e0,(shared_ptr<cs::name_space> *)&cs_impl::iostream_ext);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[9]>
                     (pdVar6,(char (*) [9])"iostream",&local_2e0);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_2e8,(shared_ptr<cs::name_space> *)&cs_impl::system_ext);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[7]>
                     (pdVar6,(char (*) [7])"system",&local_2e8);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_2f0,(shared_ptr<cs::name_space> *)&cs_impl::runtime_ext);
  pdVar6 = domain_manager::add_buildin_var<char_const(&)[8]>
                     (pdVar6,(char (*) [8])"runtime",&local_2f0);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&aStack_2f8,(shared_ptr<cs::name_space> *)&cs_impl::math_ext);
  domain_manager::add_buildin_var<char_const(&)[5]>(pdVar6,(char (*) [5])"math",&aStack_2f8);
  cs_impl::any::recycle(&aStack_2f8);
  cs_impl::any::recycle(&local_2f0);
  cs_impl::any::recycle(&local_2e8);
  cs_impl::any::recycle(&local_2e0);
  cs_impl::any::recycle(&local_2d8);
  cs_impl::any::recycle(&local_2d0);
  cs_impl::any::recycle(&local_2c8);
  cs_impl::any::recycle(&local_2c0);
  cs_impl::any::recycle(&local_2b8);
  cs_impl::any::recycle(&local_2b0);
  cs_impl::any::recycle(&local_2a8);
  cs_impl::any::recycle(&local_2a0);
  cs_impl::any::recycle(&local_298);
  cs_impl::any::recycle(&local_290);
  _Var7._M_pi = extraout_RDX;
  if (local_268.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
    _Var7._M_pi = extraout_RDX_01;
  }
  if (local_258.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var7._M_pi = extraout_RDX_02;
  }
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
    _Var7._M_pi = extraout_RDX_03;
  }
  if (local_248.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var7._M_pi = extraout_RDX_04;
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
    _Var7._M_pi = extraout_RDX_05;
  }
  if (local_238.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var7._M_pi = extraout_RDX_06;
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
    _Var7._M_pi = extraout_RDX_07;
  }
  if (local_228.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var7._M_pi = extraout_RDX_08;
  }
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
    _Var7._M_pi = extraout_RDX_09;
  }
  if (local_218.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var7._M_pi = extraout_RDX_10;
  }
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
    _Var7._M_pi = extraout_RDX_11;
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    _Var7._M_pi = extraout_RDX_12;
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    _Var7._M_pi = extraout_RDX_13;
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
    _Var7._M_pi = extraout_RDX_14;
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
    _Var7._M_pi = extraout_RDX_15;
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    _Var7._M_pi = extraout_RDX_16;
  }
  if (local_208.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var7._M_pi = extraout_RDX_17;
  }
  if (local_278 != (_Manager_type)0x0) {
    (*local_278)((_Any_data *)local_288,(_Any_data *)local_288,__destroy_functor);
    _Var7._M_pi = extraout_RDX_18;
  }
  cVar8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  cVar8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (context_t)cVar8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

context_t create_subcontext(const context_t &cxt)
	{
		cs_impl::init_extensions();
		context_t context = std::make_shared<context_type>();
		context->instance = std::make_shared<instance_type>(context, cxt->instance->fiber_sp, current_process->stack_size);
		context->compiler = cxt->compiler;
		context->cmd_args = cxt->cmd_args;
		// Init Runtime
		context->instance->storage
		// Internal Types
		.add_buildin_type("char", []() -> var { return var::make<char>('\0'); }, typeid(char),
		                  cs_impl::char_ext)
		.add_buildin_type("number", []() -> var { return var::make<numeric>(0); }, typeid(numeric))
		.add_buildin_type("integer", []() -> var { return var::make<numeric>(0); }, typeid(numeric))
		.add_buildin_type("float", []() -> var { return var::make<numeric>(0.0); }, typeid(numeric))
		.add_buildin_type("boolean", []() -> var { return var::make<boolean>(true); }, typeid(boolean))
		.add_buildin_type("pointer", []() -> var { return var::make<pointer>(null_pointer); }, typeid(pointer))
		.add_buildin_type("string", []() -> var { return var::make<string>(); }, typeid(string),
		                  cs_impl::string_ext)
		.add_buildin_type("list", []() -> var { return var::make<list>(); }, typeid(list), cs_impl::list_ext)
		.add_buildin_type("array", []() -> var { return var::make<array>(); }, typeid(array),
		                  cs_impl::array_ext)
		.add_buildin_type("pair", []() -> var { return var::make<pair>(numeric(0), numeric(0)); }, typeid(pair),
		                  cs_impl::pair_ext)
		.add_buildin_type("hash_set", []() -> var { return var::make<hash_set>(); }, typeid(hash_set),
		                  cs_impl::hash_set_ext)
		.add_buildin_type("hash_map", []() -> var { return var::make<hash_map>(); }, typeid(hash_map),
		                  cs_impl::hash_map_ext)
		// Context
		.add_buildin_var("context", var::make_constant<context_t>(context))
		// Add Internal Functions to storage
		.add_buildin_var("range", var::make_protect<callable>(range, callable::types::request_fold))
		.add_buildin_var("to_integer", make_cni(to_integer, true))
		.add_buildin_var("to_string", make_cni(to_string, true))
		.add_buildin_var("type", make_cni(type, true))
		.add_buildin_var("clone", make_cni(clone))
		.add_buildin_var("move", make_cni(move))
		.add_buildin_var("swap", make_cni(swap, true))
		.add_buildin_var("is_a", make_cni(is_a, true))
		// Add extensions to storage
		.add_buildin_var("exception", make_namespace(cs_impl::except_ext))
		.add_buildin_var("iostream", make_namespace(cs_impl::iostream_ext))
		.add_buildin_var("system", make_namespace(cs_impl::system_ext))
		.add_buildin_var("runtime", make_namespace(cs_impl::runtime_ext))
		.add_buildin_var("math", make_namespace(cs_impl::math_ext));
		return context;
	}